

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mod.c
# Opt level: O0

bool_t zzRandNZMod(word *a,word *mod,size_t n,gen_i rng,void *rng_state)

{
  bool_t bVar1;
  int iVar2;
  size_t pos;
  code *in_RCX;
  size_t in_RDX;
  word *in_RSI;
  word *in_RDI;
  undefined8 in_R8;
  size_t i;
  size_t l;
  void *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  undefined8 local_38;
  
  pos = wwBitSize((word *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                  (size_t)in_stack_ffffffffffffffb8);
  iVar2 = 0x40;
  if (pos < 0x11) {
    iVar2 = 0x80;
  }
  local_38 = (long)iVar2;
  do {
    (*in_RCX)(in_RDI,pos + 7 >> 3,in_R8);
    u64From((u64 *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
            in_stack_ffffffffffffffb8,0x16f578);
    wwTrimHi(in_RDI,in_RDX,pos);
    bVar1 = wwIsZero(in_RDI,in_RDX);
    if (bVar1 == 0) {
      iVar2 = wwCmp(in_RDI,in_RSI,in_RDX);
      in_stack_ffffffffffffffc7 = false;
      if (-1 < iVar2) goto LAB_0016f5c1;
    }
    else {
LAB_0016f5c1:
      in_stack_ffffffffffffffc7 = local_38 != 0;
      local_38 = local_38 + -1;
    }
    if ((bool)in_stack_ffffffffffffffc7 == false) {
      return (bool_t)(local_38 != -1);
    }
  } while( true );
}

Assistant:

bool_t zzRandNZMod(word a[], const word mod[], size_t n, gen_i rng, 
	void* rng_state)
{
	register size_t l;
	register size_t i;
	// pre
	ASSERT(wwIsDisjoint(a, mod, n));
	ASSERT(n > 0 && mod[n - 1] != 0 && wwCmpW(mod, n, 1) > 0);
	// генерировать
	l = wwBitSize(mod, n);
	i = (l <= 16) ? 2 * B_PER_IMPOSSIBLE : B_PER_IMPOSSIBLE;
	do
	{
		rng(a, O_OF_B(l), rng_state);
		wwFrom(a, a, O_OF_B(l));
		wwTrimHi(a, n, l);
	}
	while ((wwIsZero(a, n) || wwCmp(a, mod, n) >= 0) && i--);
	// выход
	l = 0;
	return i != SIZE_MAX;
}